

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_connection.c
# Opt level: O1

int amqp_send_frame_inner
              (amqp_connection_state_t state,amqp_frame_t *frame,int flags,amqp_time_t deadline)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  amqp_time_t deadline_00;
  ulong uVar4;
  size_t unaff_R12;
  size_t sVar5;
  uint8_t *buf;
  amqp_bytes_t encoded;
  amqp_bytes_t encoded_00;
  
  sVar5 = (state->outbound_buffer).len;
  buf = (uint8_t *)(state->outbound_buffer).bytes;
  *buf = frame->frame_type;
  *(amqp_channel_t *)(buf + 1) = frame->channel << 8 | frame->channel >> 8;
  uVar4 = 0xfffffff6;
  switch(frame->frame_type) {
  case '\x01':
    uVar3 = (frame->payload).method.id;
    *(uint *)(buf + 7) =
         uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
    encoded.len = sVar5 - 0xc;
    encoded.bytes = buf + 0xb;
    uVar3 = amqp_encode_method((frame->payload).method.id,(frame->payload).method.decoded,encoded);
    if ((int)uVar3 < 0) {
LAB_0010381d:
      unaff_R12 = (size_t)uVar3;
      uVar4 = unaff_R12;
      goto switchD_0010371c_caseD_4;
    }
    sVar5 = (size_t)(uVar3 + 4);
    break;
  case '\x02':
    uVar1 = (frame->payload).properties.class_id;
    *(ushort *)(buf + 7) = uVar1 << 8 | uVar1 >> 8;
    buf[9] = '\0';
    buf[10] = '\0';
    uVar4 = (frame->payload).properties.body_size;
    *(ulong *)(buf + 0xb) =
         uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
         (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
         (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
    encoded_00.len = sVar5 - 0x14;
    encoded_00.bytes = buf + 0x13;
    uVar3 = amqp_encode_properties
                      ((frame->payload).properties.class_id,(frame->payload).properties.decoded,
                       encoded_00);
    if ((int)uVar3 < 0) goto LAB_0010381d;
    sVar5 = (size_t)(uVar3 + 0xc);
    break;
  case '\x03':
    memcpy(buf + 7,(frame->payload).method.decoded,(frame->payload).body_fragment.len);
    sVar5 = (frame->payload).body_fragment.len;
    break;
  default:
    goto switchD_0010371c_caseD_4;
  case '\b':
    sVar5 = 0;
  }
  uVar3 = (uint)sVar5;
  *(uint *)(buf + 3) =
       uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
  buf[sVar5 + 7] = 0xce;
  unaff_R12 = sVar5 + 8;
  uVar4 = 0;
switchD_0010371c_caseD_4:
  if ((int)uVar4 == 0) {
    while( true ) {
      deadline_00 = amqp_time_first(deadline,(state->next_recv_heartbeat).time_point_ns);
      uVar4 = amqp_try_send(state,buf,unaff_R12,deadline_00,flags);
      if ((long)uVar4 < 0) break;
      unaff_R12 = unaff_R12 - uVar4;
      if (unaff_R12 == 0) {
        iVar2 = amqp_time_s_from_now(&state->next_send_heartbeat,state->heartbeat);
        return iVar2;
      }
      iVar2 = amqp_time_equal(deadline_00,deadline);
      if (iVar2 != 0) {
        uVar4 = 0xfffffff3;
        break;
      }
      uVar3 = amqp_try_recv(state);
      if (uVar3 != 0) {
        uVar4 = 0xfffffff1;
        if (uVar3 != 0xfffffff3) {
          uVar4 = (ulong)uVar3;
        }
        break;
      }
      buf = buf + uVar4;
    }
  }
  return (int)uVar4;
}

Assistant:

int amqp_send_frame_inner(amqp_connection_state_t state,
                          const amqp_frame_t *frame, int flags,
                          amqp_time_t deadline) {
  int res;
  ssize_t sent;
  amqp_bytes_t encoded;
  amqp_time_t next_timeout;

  /* TODO: if the AMQP_SF_MORE socket optimization can be shown to work
   * correctly, then this could be un-done so that body-frames are sent as 3
   * send calls, getting rid of the copy of the body content, some testing
   * would need to be done to see if this would actually a win for performance.
   * */
  res = amqp_frame_to_bytes(frame, state->outbound_buffer, &encoded);
  if (AMQP_STATUS_OK != res) {
    return res;
  }

start_send:

  next_timeout = amqp_time_first(deadline, state->next_recv_heartbeat);

  sent = amqp_try_send(state, encoded.bytes, encoded.len, next_timeout, flags);
  if (0 > sent) {
    return (int)sent;
  }

  /* A partial send has occurred, because of a heartbeat timeout (so try recv
   * something) or common timeout (so return AMQP_STATUS_TIMEOUT) */
  if ((ssize_t)encoded.len != sent) {
    if (amqp_time_equal(next_timeout, deadline)) {
      /* timeout of method was received, so return from method*/
      return AMQP_STATUS_TIMEOUT;
    }

    res = amqp_try_recv(state);

    if (AMQP_STATUS_TIMEOUT == res) {
      return AMQP_STATUS_HEARTBEAT_TIMEOUT;
    } else if (AMQP_STATUS_OK != res) {
      return res;
    }

    encoded.bytes = (uint8_t *)encoded.bytes + sent;
    encoded.len -= sent;
    goto start_send;
  }

  res = amqp_time_s_from_now(&state->next_send_heartbeat,
                             amqp_heartbeat_send(state));
  return res;
}